

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.cpp
# Opt level: O3

void __thiscall ki::protocol::dml::MessageHeader::write_to(MessageHeader *this,ostream *ostream)

{
  Field<unsigned_char> *pFVar1;
  Field<unsigned_short> *pFVar2;
  Record record;
  string local_c8;
  string local_a8;
  string local_88;
  Record local_68;
  
  ki::dml::Record::Record(&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"m_service_id","");
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(&local_68,&local_88,true);
  pFVar1->m_value = this->m_service_id;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"m_type","");
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(&local_68,&local_a8,true);
  pFVar1->m_value = this->m_type;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"m_size","");
  pFVar2 = ki::dml::Record::add_field<unsigned_short>(&local_68,&local_c8,true);
  pFVar2->m_value = this->m_size + 4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ki::dml::Record::write_to(&local_68,ostream);
  ki::dml::Record::~Record(&local_68);
  return;
}

Assistant:

void MessageHeader::write_to(std::ostream& ostream) const
	{
		ki::dml::Record record;
		record.add_field<ki::dml::UBYT>("m_service_id")->set_value(m_service_id);
		record.add_field<ki::dml::UBYT>("m_type")->set_value(m_type);
		record.add_field<ki::dml::USHRT>("m_size")->set_value(m_size + 4);
		record.write_to(ostream);
	}